

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_sptfqmr.c
# Opt level: O1

SUNErrCode SUNLinSolFree_SPTFQMR(SUNLinearSolver S)

{
  long lVar1;
  
  if (S != (SUNLinearSolver)0x0) {
    if (S->content != (void *)0x0) {
      if (*(long *)((long)S->content + 0x58) != 0) {
        N_VDestroy();
        *(undefined8 *)((long)S->content + 0x58) = 0;
      }
      if (*(long *)((long)S->content + 0x60) != 0) {
        N_VDestroy();
        *(undefined8 *)((long)S->content + 0x60) = 0;
      }
      if (*(long *)((long)S->content + 0x68) != 0) {
        N_VDestroy();
        *(undefined8 *)((long)S->content + 0x68) = 0;
      }
      if (*(long *)((long)S->content + 0x70) != 0) {
        N_VDestroy();
        *(undefined8 *)((long)S->content + 0x70) = 0;
      }
      if (*(long *)((long)S->content + 0x78) != 0) {
        N_VDestroy();
        *(undefined8 *)((long)S->content + 0x78) = 0;
      }
      lVar1 = *(long *)((long)S->content + 0x80);
      if (lVar1 != 0) {
        N_VDestroyVectorArray(lVar1,2);
        *(undefined8 *)((long)S->content + 0x80) = 0;
      }
      if (*(long *)((long)S->content + 0x88) != 0) {
        N_VDestroy();
        *(undefined8 *)((long)S->content + 0x88) = 0;
      }
      if (*(long *)((long)S->content + 0x90) != 0) {
        N_VDestroy();
        *(undefined8 *)((long)S->content + 0x90) = 0;
      }
      if (*(long *)((long)S->content + 0x98) != 0) {
        N_VDestroy();
        *(undefined8 *)((long)S->content + 0x98) = 0;
      }
      if (*(long *)((long)S->content + 0xa0) != 0) {
        N_VDestroy();
        *(undefined8 *)((long)S->content + 0xa0) = 0;
      }
      free(S->content);
      S->content = (void *)0x0;
    }
    if (S->ops != (SUNLinearSolver_Ops)0x0) {
      free(S->ops);
      S->ops = (SUNLinearSolver_Ops)0x0;
    }
    free(S);
  }
  return 0;
}

Assistant:

SUNErrCode SUNLinSolFree_SPTFQMR(SUNLinearSolver S)
{
  if (S == NULL) { return SUN_SUCCESS; }

  if (S->content)
  {
    /* delete items from within the content structure */
    if (SPTFQMR_CONTENT(S)->r_star)
    {
      N_VDestroy(SPTFQMR_CONTENT(S)->r_star);
      SPTFQMR_CONTENT(S)->r_star = NULL;
    }
    if (SPTFQMR_CONTENT(S)->q)
    {
      N_VDestroy(SPTFQMR_CONTENT(S)->q);
      SPTFQMR_CONTENT(S)->q = NULL;
    }
    if (SPTFQMR_CONTENT(S)->d)
    {
      N_VDestroy(SPTFQMR_CONTENT(S)->d);
      SPTFQMR_CONTENT(S)->d = NULL;
    }
    if (SPTFQMR_CONTENT(S)->v)
    {
      N_VDestroy(SPTFQMR_CONTENT(S)->v);
      SPTFQMR_CONTENT(S)->v = NULL;
    }
    if (SPTFQMR_CONTENT(S)->p)
    {
      N_VDestroy(SPTFQMR_CONTENT(S)->p);
      SPTFQMR_CONTENT(S)->p = NULL;
    }
    if (SPTFQMR_CONTENT(S)->r)
    {
      N_VDestroyVectorArray(SPTFQMR_CONTENT(S)->r, 2);
      SPTFQMR_CONTENT(S)->r = NULL;
    }
    if (SPTFQMR_CONTENT(S)->u)
    {
      N_VDestroy(SPTFQMR_CONTENT(S)->u);
      SPTFQMR_CONTENT(S)->u = NULL;
    }
    if (SPTFQMR_CONTENT(S)->vtemp1)
    {
      N_VDestroy(SPTFQMR_CONTENT(S)->vtemp1);
      SPTFQMR_CONTENT(S)->vtemp1 = NULL;
    }
    if (SPTFQMR_CONTENT(S)->vtemp2)
    {
      N_VDestroy(SPTFQMR_CONTENT(S)->vtemp2);
      SPTFQMR_CONTENT(S)->vtemp2 = NULL;
    }
    if (SPTFQMR_CONTENT(S)->vtemp3)
    {
      N_VDestroy(SPTFQMR_CONTENT(S)->vtemp3);
      SPTFQMR_CONTENT(S)->vtemp3 = NULL;
    }
    free(S->content);
    S->content = NULL;
  }
  if (S->ops)
  {
    free(S->ops);
    S->ops = NULL;
  }
  free(S);
  S = NULL;
  return SUN_SUCCESS;
}